

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddCache.c
# Opt level: O2

DdNode * cuddCacheLookup(DdManager *table,ptruint op,DdNode *f,DdNode *g,DdNode *h)

{
  uint uVar1;
  DdNode *pDVar2;
  DdCache *pDVar3;
  uint uVar4;
  double dVar5;
  
  uVar4 = (uint)op & 0xe;
  uVar1 = ((((uint)h & 1) + *(int *)(((ulong)h & 0xfffffffffffffffe) + 0x20) * 2 +
           (uVar4 | ((uint)f & 1) + *(int *)(((ulong)f & 0xfffffffffffffffe) + 0x20) * 2)) *
           0xc00005 +
          ((uint)(op >> 4) | ((uint)g & 1) + *(int *)(((ulong)g & 0xfffffffffffffffe) + 0x20) * 2))
          * 0x40f1f9 >> ((byte)table->cacheShift & 0x1f);
  pDVar2 = table->cache[(int)uVar1].data;
  if ((((pDVar2 == (DdNode *)0x0) ||
       (pDVar3 = table->cache + (int)uVar1, pDVar3->f != (DdNode *)((ulong)uVar4 | (ulong)f))) ||
      (pDVar3->g != (DdNode *)(op >> 4 | (ulong)g))) || ((DdNode *)pDVar3->h != h)) {
    dVar5 = table->cacheMisses + 1.0;
    table->cacheMisses = dVar5;
    if ((-1 < table->cacheSlack) && (dVar5 * table->minHit < table->cacheHits)) {
      cuddCacheResize(table);
    }
    pDVar2 = (DdNode *)0x0;
  }
  else {
    table->cacheHits = table->cacheHits + 1.0;
    if (((DdNode *)((ulong)pDVar2 & 0xfffffffffffffffe))->ref == 0) {
      cuddReclaim(table,(DdNode *)((ulong)pDVar2 & 0xfffffffffffffffe));
      pDVar2 = pDVar3->data;
    }
  }
  return pDVar2;
}

Assistant:

DdNode *
cuddCacheLookup(
  DdManager * table,
  ptruint op,
  DdNode * f,
  DdNode * g,
  DdNode * h)
{
    int posn;
    DdCache *en,*cache;
    DdNode *data;
    ptruint uf, ug, uh;
    ptruint ufc, ugc, uhc;

    uf = (ptruint) f | (op & 0xe);
    ug = (ptruint) g | (op >> 4);
    uh = (ptruint) h;

    ufc = (ptruint) cuddF2L(f) | (op & 0xe);
    ugc = (ptruint) cuddF2L(g) | (op >> 4);
    uhc = (ptruint) cuddF2L(h);

    cache = table->cache;
#ifdef DD_DEBUG
    if (cache == NULL) {
        return(NULL);
    }
#endif

    posn = ddCHash2(uhc,ufc,ugc,table->cacheShift);
    en = &cache[posn];
    if (en->data != NULL && en->f==(DdNodePtr)uf && en->g==(DdNodePtr)ug && en->h==uh) {
        data = Cudd_Regular(en->data);
        table->cacheHits++;
        if (data->ref == 0) {
            cuddReclaim(table,data);
        }
        return(en->data);
    }

    /* Cache miss: decide whether to resize. */
    table->cacheMisses++;

    if (table->cacheSlack >= 0 &&
        table->cacheHits > table->cacheMisses * table->minHit) {
        cuddCacheResize(table);
    }

    return(NULL);

}